

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O0

int make_file_entry(archive_write *a,xml_writer *writer,file *file)

{
  void *pvVar1;
  int iVar2;
  mode_t mVar3;
  wchar_t wVar4;
  la_int64_t lVar5;
  dev_t dVar6;
  int *piVar7;
  char *pcVar8;
  time_t tVar9;
  size_t local_98;
  size_t size;
  void *value;
  char *name;
  int r2;
  int r;
  size_t len;
  char *p;
  heap_data *heap;
  archive_string linkto;
  char *fflags;
  char *filelink;
  char *filetype;
  xar_conflict *xar;
  file *file_local;
  xml_writer *writer_local;
  archive_write *a_local;
  
  pvVar1 = a->format_data;
  name._0_4_ = L'\0';
  iVar2 = is_u8_zstring_latin1((file->basename).s);
  if (iVar2 == 0) {
    name._4_4_ = xml_writer_start_element(writer,"name");
    if (name._4_4_ < 0) {
      archive_set_error(&a->archive,-1,"xml_writer_start_element() failed: %d",
                        (ulong)(uint)name._4_4_);
      return -0x1e;
    }
    name._4_4_ = xml_writer_write_attribute(writer,"enctype","base64");
    if (name._4_4_ < 0) {
      archive_set_error(&a->archive,-1,"xml_writer_write_attribute() failed: %d",
                        (ulong)(uint)name._4_4_);
      return -0x1e;
    }
    name._4_4_ = xml_writer_write_base64
                           (writer,(file->basename).s,0,(long)(int)(file->basename).length);
    if (name._4_4_ < 0) {
      archive_set_error(&a->archive,-1,"xml_writer_write_base64() failed: %d",
                        (ulong)(uint)name._4_4_);
      return -0x1e;
    }
    name._4_4_ = xml_writer_end_element(writer);
    if (name._4_4_ < 0) {
      archive_set_error(&a->archive,-1,"xml_writer_end_element() failed: %d",(ulong)(uint)name._4_4_
                       );
      return -0x1e;
    }
  }
  else {
    name._4_4_ = xmlwrite_string(a,writer,"name",(file->basename).s);
    if (name._4_4_ < 0) {
      return -0x1e;
    }
  }
  fflags = (char *)0x0;
  heap = (heap_data *)0x0;
  linkto.s = (char *)0x0;
  linkto.length = 0;
  mVar3 = archive_entry_filetype(file->entry);
  if (mVar3 == 0x1000) {
    filelink = "fifo";
  }
  else if (mVar3 == 0x2000) {
    filelink = "character special";
  }
  else if (mVar3 == 0x4000) {
    filelink = "directory";
  }
  else if (mVar3 == 0x6000) {
    filelink = "block special";
  }
  else {
    if (mVar3 != 0x8000) {
      if (mVar3 == 0xa000) {
        filelink = "symlink";
        goto LAB_0019c875;
      }
      if (mVar3 == 0xc000) {
        filelink = "socket";
        goto LAB_0019c875;
      }
    }
    if (file->hardlink_target == (file *)0x0) {
      filelink = "file";
    }
    else {
      filelink = "hardlink";
      fflags = "link";
      if (file->hardlink_target == file) {
        linkto.s = (char *)0x0;
        archive_strncat((archive_string *)&heap,"original",8);
      }
      else {
        archive_string_sprintf((archive_string *)&heap,"%d",(ulong)(uint)file->hardlink_target->id);
      }
    }
  }
LAB_0019c875:
  name._4_4_ = xmlwrite_string_attr(a,writer,"type",filelink,fflags,(char *)heap);
  archive_string_free((archive_string *)&heap);
  if (name._4_4_ < 0) {
    a_local._4_4_ = L'\xffffffe2';
  }
  else if ((file->field_0x168 & 1) == 0) {
    mVar3 = archive_entry_filetype(file->entry);
    if ((mVar3 == 0x2000) || (mVar3 == 0x6000)) {
      name._4_4_ = xml_writer_start_element(writer,"device");
      if (name._4_4_ < 0) {
        archive_set_error(&a->archive,-1,"xml_writer_start_element() failed: %d",
                          (ulong)(uint)name._4_4_);
        return -0x1e;
      }
      dVar6 = archive_entry_rdevmajor(file->entry);
      name._4_4_ = xmlwrite_fstring(a,writer,"major","%d",dVar6);
      if (name._4_4_ < 0) {
        return -0x1e;
      }
      dVar6 = archive_entry_rdevminor(file->entry);
      name._4_4_ = xmlwrite_fstring(a,writer,"minor","%d",dVar6);
      if (name._4_4_ < 0) {
        return -0x1e;
      }
      name._4_4_ = xml_writer_end_element(writer);
      if (name._4_4_ < 0) {
        archive_set_error(&a->archive,-1,"xml_writer_end_element() failed: %d",
                          (ulong)(uint)name._4_4_);
        return -0x1e;
      }
    }
    else if ((mVar3 == 0xa000) &&
            (name._4_4_ = xmlwrite_string_attr(a,writer,"link",(file->symlink).s,"type","broken"),
            name._4_4_ < 0)) {
      return -0x1e;
    }
    lVar5 = archive_entry_ino64(file->entry);
    name._4_4_ = xmlwrite_fstring(a,writer,"inode","%jd",lVar5);
    if (name._4_4_ < 0) {
      a_local._4_4_ = L'\xffffffe2';
    }
    else {
      dVar6 = archive_entry_dev(file->entry);
      if (dVar6 != 0) {
        dVar6 = archive_entry_dev(file->entry);
        name._4_4_ = xmlwrite_fstring(a,writer,"deviceno","%d",dVar6);
        if (name._4_4_ < 0) {
          return -0x1e;
        }
      }
      mVar3 = archive_entry_mode(file->entry);
      name._4_4_ = xmlwrite_mode(a,writer,"mode",mVar3);
      if (name._4_4_ < 0) {
        a_local._4_4_ = L'\xffffffe2';
      }
      else {
        lVar5 = archive_entry_uid(file->entry);
        name._4_4_ = xmlwrite_fstring(a,writer,"uid","%d",lVar5);
        if (name._4_4_ < 0) {
          a_local._4_4_ = L'\xffffffe2';
        }
        else {
          name._4_4_ = _archive_entry_uname_l
                                 (file->entry,(char **)&len,(size_t *)&r2,
                                  *(archive_string_conv **)((long)pvVar1 + 0x118));
          if (name._4_4_ != L'\0') {
            piVar7 = __errno_location();
            if (*piVar7 == 0xc) {
              archive_set_error(&a->archive,0xc,"Can\'t allocate memory for Uname");
              return -0x1e;
            }
            pcVar8 = archive_entry_uname(file->entry);
            archive_set_error(&a->archive,0x54,"Can\'t translate uname \'%s\' to UTF-8",pcVar8);
            name._0_4_ = L'\xffffffec';
          }
          if ((_r2 == 0) ||
             (name._4_4_ = xmlwrite_string(a,writer,"user",(char *)len), L'\xffffffff' < name._4_4_)
             ) {
            lVar5 = archive_entry_gid(file->entry);
            name._4_4_ = xmlwrite_fstring(a,writer,"gid","%d",lVar5);
            if (name._4_4_ < 0) {
              a_local._4_4_ = L'\xffffffe2';
            }
            else {
              name._4_4_ = _archive_entry_gname_l
                                     (file->entry,(char **)&len,(size_t *)&r2,
                                      *(archive_string_conv **)((long)pvVar1 + 0x118));
              if (name._4_4_ != L'\0') {
                piVar7 = __errno_location();
                if (*piVar7 == 0xc) {
                  archive_set_error(&a->archive,0xc,"Can\'t allocate memory for Gname");
                  return -0x1e;
                }
                pcVar8 = archive_entry_gname(file->entry);
                archive_set_error(&a->archive,0x54,"Can\'t translate gname \'%s\' to UTF-8",pcVar8);
                name._0_4_ = L'\xffffffec';
              }
              if ((_r2 == 0) ||
                 (name._4_4_ = xmlwrite_string(a,writer,"group",(char *)len),
                 L'\xffffffff' < name._4_4_)) {
                wVar4 = archive_entry_ctime_is_set(file->entry);
                if (wVar4 != L'\0') {
                  tVar9 = archive_entry_ctime(file->entry);
                  name._4_4_ = xmlwrite_time(a,writer,"ctime",tVar9,1);
                  if (name._4_4_ < L'\0') {
                    return -0x1e;
                  }
                }
                wVar4 = archive_entry_mtime_is_set(file->entry);
                if (wVar4 != L'\0') {
                  tVar9 = archive_entry_mtime(file->entry);
                  name._4_4_ = xmlwrite_time(a,writer,"mtime",tVar9,1);
                  if (name._4_4_ < L'\0') {
                    return -0x1e;
                  }
                }
                wVar4 = archive_entry_atime_is_set(file->entry);
                if (wVar4 != L'\0') {
                  tVar9 = archive_entry_atime(file->entry);
                  name._4_4_ = xmlwrite_time(a,writer,"atime",tVar9,1);
                  if (name._4_4_ < L'\0') {
                    return -0x1e;
                  }
                }
                linkto.buffer_length = (size_t)archive_entry_fflags_text(file->entry);
                if (((char *)linkto.buffer_length == (char *)0x0) ||
                   ((name._4_4_ = make_fflags_entry(a,writer,"flags",(char *)linkto.buffer_length),
                    a_local._4_4_ = name._4_4_, L'\xffffffff' < name._4_4_ &&
                    (name._4_4_ = make_fflags_entry(a,writer,"ext2",(char *)linkto.buffer_length),
                    a_local._4_4_ = name._4_4_, L'\xffffffff' < name._4_4_)))) {
                  archive_entry_xattr_reset(file->entry);
                  for (p = (char *)(file->xattr).first; p != (char *)0x0; p = *(char **)(p + 8)) {
                    archive_entry_xattr_next(file->entry,(char **)&value,(void **)&size,&local_98);
                    name._4_4_ = xml_writer_start_element(writer,"ea");
                    if (name._4_4_ < 0) {
                      archive_set_error(&a->archive,-1,"xml_writer_start_element() failed: %d",
                                        (ulong)(uint)name._4_4_);
                      return -0x1e;
                    }
                    name._4_4_ = xml_writer_write_attributef(writer,"id","%d",(ulong)*(uint *)p);
                    if (name._4_4_ < 0) {
                      archive_set_error(&a->archive,-1,"xml_writer_write_attributef() failed: %d",
                                        (ulong)(uint)name._4_4_);
                      return -0x1e;
                    }
                    name._4_4_ = xmlwrite_heap(a,writer,(heap_data *)p);
                    if (name._4_4_ < 0) {
                      return -0x1e;
                    }
                    name._4_4_ = xmlwrite_string(a,writer,"name",(char *)value);
                    if (name._4_4_ < 0) {
                      return -0x1e;
                    }
                    name._4_4_ = xml_writer_end_element(writer);
                    if (name._4_4_ < L'\0') {
                      archive_set_error(&a->archive,-1,"xml_writer_end_element() failed: %d",
                                        (ulong)(uint)name._4_4_);
                      return -0x1e;
                    }
                  }
                  if ((file->data).length != 0) {
                    name._4_4_ = xml_writer_start_element(writer,"data");
                    if (name._4_4_ < 0) {
                      archive_set_error(&a->archive,-1,"xml_writer_start_element() failed: %d",
                                        (ulong)(uint)name._4_4_);
                      return -0x1e;
                    }
                    name._4_4_ = xmlwrite_heap(a,writer,&file->data);
                    if (name._4_4_ < 0) {
                      return -0x1e;
                    }
                    name._4_4_ = xml_writer_end_element(writer);
                    if (name._4_4_ < L'\0') {
                      archive_set_error(&a->archive,-1,"xml_writer_end_element() failed: %d",
                                        (ulong)(uint)name._4_4_);
                      return -0x1e;
                    }
                  }
                  if ((file->script).length != 0) {
                    name._4_4_ = xml_writer_start_element(writer,"content");
                    if (name._4_4_ < 0) {
                      archive_set_error(&a->archive,-1,"xml_writer_start_element() failed: %d",
                                        (ulong)(uint)name._4_4_);
                      return -0x1e;
                    }
                    name._4_4_ = xmlwrite_string(a,writer,"interpreter",(file->script).s);
                    if (name._4_4_ < 0) {
                      return -0x1e;
                    }
                    name._4_4_ = xmlwrite_string(a,writer,"type","script");
                    if (name._4_4_ < 0) {
                      return -0x1e;
                    }
                    name._4_4_ = xml_writer_end_element(writer);
                    if (name._4_4_ < 0) {
                      archive_set_error(&a->archive,-1,"xml_writer_end_element() failed: %d",
                                        (ulong)(uint)name._4_4_);
                      return -0x1e;
                    }
                  }
                  a_local._4_4_ = (wchar_t)name;
                }
              }
              else {
                a_local._4_4_ = L'\xffffffe2';
              }
            }
          }
          else {
            a_local._4_4_ = L'\xffffffe2';
          }
        }
      }
    }
  }
  else {
    a_local._4_4_ = L'\0';
  }
  return a_local._4_4_;
}

Assistant:

static int
make_file_entry(struct archive_write *a, struct xml_writer *writer,
    struct file *file)
{
	struct xar *xar;
	const char *filetype, *filelink, *fflags;
	struct archive_string linkto;
	struct heap_data *heap;
	const char *p;
	size_t len;
	int r, r2;

	xar = (struct xar *)a->format_data;
	r2 = ARCHIVE_OK;

	/*
	 * Make a file name entry, "<name>".
	 */
	if (!is_u8_zstring_latin1(file->basename.s)) {
		r = xml_writer_start_element(writer, "name");
		if (r < 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_MISC,
			    "xml_writer_start_element() failed: %d", r);
			return (ARCHIVE_FATAL);
		}
		r = xml_writer_write_attribute(writer,
		    "enctype", "base64");
		if (r < 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_MISC,
			    "xml_writer_write_attribute() failed: %d", r);
			return (ARCHIVE_FATAL);
		}
		r = xml_writer_write_base64(writer, file->basename.s,
		    0, (int)archive_strlen(&(file->basename)));
		if (r < 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_MISC,
			    "xml_writer_write_base64() failed: %d", r);
			return (ARCHIVE_FATAL);
		}
		r = xml_writer_end_element(writer);
		if (r < 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_MISC,
			    "xml_writer_end_element() failed: %d", r);
			return (ARCHIVE_FATAL);
		}
	} else {
		r = xmlwrite_string(a, writer, "name", file->basename.s);
		if (r < 0)
			return (ARCHIVE_FATAL);
	}

	/*
	 * Make a file type entry, "<type>".
	 */
	filelink = NULL;
	archive_string_init(&linkto);
	switch (archive_entry_filetype(file->entry)) {
	case AE_IFDIR:
		filetype = "directory"; break;
	case AE_IFLNK:
		filetype = "symlink"; break;
	case AE_IFCHR:
		filetype = "character special"; break;
	case AE_IFBLK:
		filetype = "block special"; break;
	case AE_IFSOCK:
		filetype = "socket"; break;
	case AE_IFIFO:
		filetype = "fifo"; break;
	case AE_IFREG:
	default:
		if (file->hardlink_target != NULL) {
			filetype = "hardlink";
			filelink = "link";
			if (file->hardlink_target == file)
				archive_strcpy(&linkto, "original");
			else
				archive_string_sprintf(&linkto, "%d",
				    file->hardlink_target->id);
		} else
			filetype = "file";
		break;
	}
	r = xmlwrite_string_attr(a, writer, "type", filetype,
	    filelink, linkto.s);
	archive_string_free(&linkto);
	if (r < 0)
		return (ARCHIVE_FATAL);

	/*
	 * On a virtual directory, we record "name" and "type" only.
	 */
	if (file->virtual)
		return (ARCHIVE_OK);

	switch (archive_entry_filetype(file->entry)) {
	case AE_IFLNK:
		/*
		 * xar utility has checked a file type, which
		 * a symbolic-link file has referenced.
		 * For example:
		 *   <link type="directory">../ref/</link>
		 *   The symlink target file is "../ref/" and its
		 *   file type is a directory.
		 *
		 *   <link type="file">../f</link>
		 *   The symlink target file is "../f" and its
		 *   file type is a regular file.
		 *
		 * But our implementation cannot do it, and then we
		 * always record that a attribute "type" is "broken",
		 * for example:
		 *   <link type="broken">foo/bar</link>
		 *   It means "foo/bar" is not reachable.
		 */
		r = xmlwrite_string_attr(a, writer, "link",
		    file->symlink.s,
		    "type", "broken");
		if (r < 0)
			return (ARCHIVE_FATAL);
		break;
	case AE_IFCHR:
	case AE_IFBLK:
		r = xml_writer_start_element(writer, "device");
		if (r < 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_MISC,
			    "xml_writer_start_element() failed: %d", r);
			return (ARCHIVE_FATAL);
		}
		r = xmlwrite_fstring(a, writer, "major",
		    "%d", archive_entry_rdevmajor(file->entry));
		if (r < 0)
			return (ARCHIVE_FATAL);
		r = xmlwrite_fstring(a, writer, "minor",
		    "%d", archive_entry_rdevminor(file->entry));
		if (r < 0)
			return (ARCHIVE_FATAL);
		r = xml_writer_end_element(writer);
		if (r < 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_MISC,
			    "xml_writer_end_element() failed: %d", r);
			return (ARCHIVE_FATAL);
		}
		break;
	default:
		break;
	}

	/*
	 * Make a inode entry, "<inode>".
	 */
	r = xmlwrite_fstring(a, writer, "inode",
	    "%jd", archive_entry_ino64(file->entry));
	if (r < 0)
		return (ARCHIVE_FATAL);
	if (archive_entry_dev(file->entry) != 0) {
		r = xmlwrite_fstring(a, writer, "deviceno",
		    "%d", archive_entry_dev(file->entry));
		if (r < 0)
			return (ARCHIVE_FATAL);
	}

	/*
	 * Make a file mode entry, "<mode>".
	 */
	r = xmlwrite_mode(a, writer, "mode",
	    archive_entry_mode(file->entry));
	if (r < 0)
		return (ARCHIVE_FATAL);

	/*
	 * Make a user entry, "<uid>" and "<user>.
	 */
	r = xmlwrite_fstring(a, writer, "uid",
	    "%d", archive_entry_uid(file->entry));
	if (r < 0)
		return (ARCHIVE_FATAL);
	r = archive_entry_uname_l(file->entry, &p, &len, xar->sconv);
	if (r != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Uname");
			return (ARCHIVE_FATAL);
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Can't translate uname '%s' to UTF-8",
		    archive_entry_uname(file->entry));
		r2 = ARCHIVE_WARN;
	}
	if (len > 0) {
		r = xmlwrite_string(a, writer, "user", p);
		if (r < 0)
			return (ARCHIVE_FATAL);
	}

	/*
	 * Make a group entry, "<gid>" and "<group>.
	 */
	r = xmlwrite_fstring(a, writer, "gid",
	    "%d", archive_entry_gid(file->entry));
	if (r < 0)
		return (ARCHIVE_FATAL);
	r = archive_entry_gname_l(file->entry, &p, &len, xar->sconv);
	if (r != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Gname");
			return (ARCHIVE_FATAL);
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Can't translate gname '%s' to UTF-8",
		    archive_entry_gname(file->entry));
		r2 = ARCHIVE_WARN;
	}
	if (len > 0) {
		r = xmlwrite_string(a, writer, "group", p);
		if (r < 0)
			return (ARCHIVE_FATAL);
	}

	/*
	 * Make a ctime entry, "<ctime>".
	 */
	if (archive_entry_ctime_is_set(file->entry)) {
		r = xmlwrite_time(a, writer, "ctime",
		    archive_entry_ctime(file->entry), 1);
		if (r < 0)
			return (ARCHIVE_FATAL);
	}

	/*
	 * Make a mtime entry, "<mtime>".
	 */
	if (archive_entry_mtime_is_set(file->entry)) {
		r = xmlwrite_time(a, writer, "mtime",
		    archive_entry_mtime(file->entry), 1);
		if (r < 0)
			return (ARCHIVE_FATAL);
	}

	/*
	 * Make a atime entry, "<atime>".
	 */
	if (archive_entry_atime_is_set(file->entry)) {
		r = xmlwrite_time(a, writer, "atime",
		    archive_entry_atime(file->entry), 1);
		if (r < 0)
			return (ARCHIVE_FATAL);
	}

	/*
	 * Make fflags entries, "<flags>" and "<ext2>".
	 */
	fflags = archive_entry_fflags_text(file->entry);
	if (fflags != NULL) {
		r = make_fflags_entry(a, writer, "flags", fflags);
		if (r < 0)
			return (r);
		r = make_fflags_entry(a, writer, "ext2", fflags);
		if (r < 0)
			return (r);
	}

	/*
	 * Make extended attribute entries, "<ea>".
	 */
	archive_entry_xattr_reset(file->entry);
	for (heap = file->xattr.first; heap != NULL; heap = heap->next) {
		const char *name;
		const void *value;
		size_t size;

		archive_entry_xattr_next(file->entry,
		    &name, &value, &size);
		r = xml_writer_start_element(writer, "ea");
		if (r < 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_MISC,
			    "xml_writer_start_element() failed: %d", r);
			return (ARCHIVE_FATAL);
		}
		r = xml_writer_write_attributef(writer,
		    "id", "%d", heap->id);
		if (r < 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_MISC,
			    "xml_writer_write_attributef() failed: %d", r);
			return (ARCHIVE_FATAL);
		}
		r = xmlwrite_heap(a, writer, heap);
		if (r < 0)
			return (ARCHIVE_FATAL);
		r = xmlwrite_string(a, writer, "name", name);
		if (r < 0)
			return (ARCHIVE_FATAL);

		r = xml_writer_end_element(writer);
		if (r < 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_MISC,
			    "xml_writer_end_element() failed: %d", r);
			return (ARCHIVE_FATAL);
		}
	}

	/*
	 * Make a file data entry, "<data>".
	 */
	if (file->data.length > 0) {
		r = xml_writer_start_element(writer, "data");
		if (r < 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_MISC,
			    "xml_writer_start_element() failed: %d", r);
			return (ARCHIVE_FATAL);
		}

		r = xmlwrite_heap(a, writer, &(file->data));
		if (r < 0)
			return (ARCHIVE_FATAL);

		r = xml_writer_end_element(writer);
		if (r < 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_MISC,
			    "xml_writer_end_element() failed: %d", r);
			return (ARCHIVE_FATAL);
		}
	}

	if (archive_strlen(&file->script) > 0) {
		r = xml_writer_start_element(writer, "content");
		if (r < 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_MISC,
			    "xml_writer_start_element() failed: %d", r);
			return (ARCHIVE_FATAL);
		}

		r = xmlwrite_string(a, writer,
		    "interpreter", file->script.s);
		if (r < 0)
			return (ARCHIVE_FATAL);

		r = xmlwrite_string(a, writer, "type", "script");
		if (r < 0)
			return (ARCHIVE_FATAL);

		r = xml_writer_end_element(writer);
		if (r < 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_MISC,
			    "xml_writer_end_element() failed: %d", r);
			return (ARCHIVE_FATAL);
		}
	}

	return (r2);
}